

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O0

expected<idx2::chunk_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunk
          (expected<idx2::chunk_cache,_idx2::idx2_err_code> *__return_storage_ptr__,idx2_file *Idx2,
          decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  ulong uVar5;
  mallocator *pmVar6;
  unsigned_long *Key;
  error<idx2::idx2_err_code> eVar7;
  error<idx2::idx2_err_code> eVar8;
  byte local_461;
  long local_418;
  byte local_3b9;
  undefined1 local_350 [8];
  bitstream ChunkStream;
  i64 ChunkSize;
  i64 ChunkOffset;
  i32 ChunkPos;
  undefined2 local_300;
  bool bStack_2fe;
  anon_class_8_1_1e916d15 local_2f8;
  cstr local_2f0;
  undefined2 local_2e8;
  undefined1 uStack_2e6;
  undefined5 uStack_2e5;
  undefined1 local_2e0 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:163:5)>
  __ScopeGuard__163;
  anon_class_8_1_3fcf61a8_for_Func __CleanUpFunc__163;
  FILE *Fp;
  timer IOTimer;
  chunk_cache *ChunkCache;
  undefined2 local_2a0;
  bool bStack_29e;
  anon_class_1_0_00000001 local_291;
  cstr local_290;
  undefined2 local_288;
  undefined1 uStack_286;
  undefined5 uStack_285;
  iterator local_280;
  unsigned_long *local_260;
  iterator ChunkCacheIt;
  file_cache *FileCache;
  u64 ChunkAddress;
  error<idx2::idx2_err_code> local_228;
  anon_class_8_1_1e916d15 local_218;
  allocator *local_210;
  undefined2 local_208;
  undefined1 uStack_206;
  undefined5 uStack_205;
  undefined7 local_200;
  undefined4 uStack_1f9;
  undefined5 uStack_1f5;
  undefined7 uStack_1f0;
  undefined1 uStack_1e9;
  error<idx2::idx2_err_code> Result;
  iterator FileCacheIt;
  anon_union_8_2_2df48d06_for_stref_0 local_1b0;
  file_id FileId;
  unique_lock<std::mutex> Lock;
  i8 Subband_local;
  i8 Level_local;
  u64 Brick_local;
  decode_data *D_local;
  idx2_file *Idx2_local;
  undefined1 local_a0 [8];
  timespec End;
  i8 I;
  i8 I_1;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&FileId.Id,&D->FileCacheMutex);
  Key = (unsigned_long *)(ulong)(uint)(int)Level;
  ConstructFilePath((file_id *)&local_1b0,Idx2,Brick,Level,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)&Result.Code,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Name.Size,Key);
  eVar7 = ParallelReadFile(Idx2,D,(iterator *)&Result.Code,(file_id *)&local_1b0);
  local_200 = eVar7.Msg._0_7_;
  uStack_1f9 = eVar7._7_4_;
  uStack_1f5 = eVar7._11_5_;
  uStack_1f0 = local_200;
  _uStack_1e9 = uStack_1f9;
  bVar4 = error::operator_cast_to_bool((error *)&uStack_1f0);
  if ((bVar4) &&
     (*(char *)((long)&(FileCacheIt.Ht)->Keys +
               (long)&(((FileCacheIt.Val)->ChunkOffsets).Buffer.Alloc)->_vptr_allocator) == '\x02'))
  {
    if (0xf < Level) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]")
      ;
    }
    uVar5 = (ulong)(Idx2->BricksPerChunk).Arr[(int)Level];
    if (uVar5 == 0) {
      local_3b9 = 0xff;
    }
    else {
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      local_3b9 = 0x3f - ((byte)lVar2 ^ 0x3f);
    }
    FileCache = (file_cache *)
                (((long)Level << 0x3c) +
                 (Brick >> (local_3b9 + (uVar5 != 1L << (local_3b9 & 0x3f)) & 0x3f)) * 0x40000 +
                 (long)((int)Subband << 0xc) + (long)((long)BpKey & 0xfffU));
    ChunkCacheIt.Idx = (i64)FileCacheIt.Key;
    Lookup<unsigned_long,idx2::chunk_cache>
              (&local_280,(idx2 *)(FileCacheIt.Key + 6),
               (hash_table<unsigned_long,_idx2::chunk_cache> *)&FileCache,
               (unsigned_long *)((long)BpKey & 0xfffU));
    local_260 = local_280.Key;
    ChunkCacheIt.Key = (unsigned_long *)local_280.Val;
    ChunkCacheIt.Val = (chunk_cache *)local_280.Ht;
    ChunkCacheIt.Ht = (hash_table<unsigned_long,_idx2::chunk_cache> *)local_280.Idx;
    if (*(char *)((long)(unsigned_long **)local_280.Idx +
                 (((array<unsigned_long> *)&(local_280.Ht)->Vals)->Buffer).Bytes) == '\x02') {
      IOTimer.Start.tv_nsec = (__syscall_slong_t)local_280.Val;
      if (((local_280.Val)->ChunkStream).Stream.Bytes == 0) {
        clock_gettime(1,(timespec *)&Fp);
        __CleanUpFunc__163.Fp = (FILE **)fopen(local_1b0.Ptr,"rb");
        __ScopeGuard__163._8_8_ = &__CleanUpFunc__163;
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:163:5)>
        ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:163:5)>
                       *)local_2e0,(anon_class_8_1_3fcf61a8_for_Func *)&__ScopeGuard__163.Dismissed)
        ;
        if (__CleanUpFunc__163.Fp == (FILE **)0x0) {
          local_2f8.FileId = (file_id *)&local_1b0;
          eVar7 = ParallelReadChunk::anon_class_8_1_1e916d15::operator()(&local_2f8);
          local_2f0 = eVar7.Msg;
          local_300 = eVar7._8_2_;
          local_2e8 = local_300;
          bStack_2fe = eVar7.StrGened;
          uStack_2e6 = bStack_2fe;
          __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffaa0;
          (__return_storage_ptr__->field_1).Err.Msg = local_2f0;
          (__return_storage_ptr__->field_1).Val.Bricks.Buffer.Data =
               (byte *)CONCAT53(uStack_2e5,eVar7._8_3_);
          __return_storage_ptr__->Ok = false;
          ChunkAddress._4_4_ = 1;
        }
        else {
          iVar1 = *(int *)IOTimer.Start.tv_nsec;
          if (iVar1 < 1) {
            local_418 = 0;
          }
          else {
            local_418 = *(long *)(*(long *)ChunkCacheIt.Idx + (long)(iVar1 + -1) * 8);
          }
          ChunkStream._40_8_ = *(long *)(*(long *)ChunkCacheIt.Idx + (long)iVar1 * 8) - local_418;
          fseeko((FILE *)__CleanUpFunc__163.Fp,local_418,0);
          bitstream::bitstream((bitstream *)local_350);
          uVar3 = ChunkStream._40_8_;
          pmVar6 = Mallocator();
          (**(pmVar6->super_allocator)._vptr_allocator)(pmVar6,local_350,uVar3 + 8);
          ChunkStream.Stream.Alloc = (allocator *)local_350;
          ChunkStream.BitBuf._0_4_ = 0;
          ChunkStream.BitPtr = (byte *)0x0;
          fread((void *)local_350,(size_t)ChunkStream.Stream.Data,1,(FILE *)__CleanUpFunc__163.Fp);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(D->BytesData_).super___atomic_base<unsigned_long>,
                     (__int_type_conflict)ChunkStream.Stream.Data);
          End.tv_nsec = (__syscall_slong_t)&Fp;
          clock_gettime(1,(timespec *)local_a0);
          std::__atomic_base<unsigned_long>::operator+=
                    (&(D->DecodeIOTime_).super___atomic_base<unsigned_long>,
                     (long)((double)((long)local_a0 - *(long *)End.tv_nsec) * 1000000000.0 +
                           (double)(End.tv_sec - *(long *)(End.tv_nsec + 8))));
          if (0xf < Level) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
          }
          uVar5 = (ulong)(Idx2->BricksPerChunk).Arr[(int)Level];
          if (uVar5 == 0) {
            local_461 = 0xff;
          }
          else {
            lVar2 = 0x3f;
            if (uVar5 != 0) {
              for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
              }
            }
            local_461 = 0x3f - ((byte)lVar2 ^ 0x3f);
          }
          DecompressChunk((bitstream *)local_350,(chunk_cache *)IOTimer.Start.tv_nsec,(u64)FileCache
                          ,(int)(char)(local_461 + (uVar5 != 1L << (local_461 & 0x3f))));
          ChunkAddress._4_4_ = 0;
        }
        scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp:163:5)>
        ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelRead_cpp:163:5)>
                        *)local_2e0);
        eVar7.Code = local_228.Code;
        eVar7.StackIdx = local_228.StackIdx;
        eVar7.StrGened = local_228.StrGened;
        eVar7._11_5_ = local_228._11_5_;
        eVar7.Msg = local_228.Msg;
        if (ChunkAddress._4_4_ != 0) goto LAB_0027e9bb;
      }
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffaa0;
      memcpy(&__return_storage_ptr__->field_1,(void *)IOTimer.Start.tv_nsec,0xa0);
      eVar7.Code = local_228.Code;
      eVar7.StackIdx = local_228.StackIdx;
      eVar7.StrGened = local_228.StrGened;
      eVar7._11_5_ = local_228._11_5_;
      eVar7.Msg = local_228.Msg;
      __return_storage_ptr__->Ok = true;
      ChunkAddress._4_4_ = 1;
    }
    else {
      eVar8 = ParallelReadChunk::anon_class_1_0_00000001::operator()(&local_291);
      eVar7.Code = local_228.Code;
      eVar7.StackIdx = local_228.StackIdx;
      eVar7.StrGened = local_228.StrGened;
      eVar7._11_5_ = local_228._11_5_;
      eVar7.Msg = local_228.Msg;
      local_290 = eVar8.Msg;
      local_2a0 = eVar8._8_2_;
      local_288 = local_2a0;
      bStack_29e = eVar8.StrGened;
      uStack_286 = bStack_29e;
      __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffaa0;
      (__return_storage_ptr__->field_1).Err.Msg = local_290;
      (__return_storage_ptr__->field_1).Val.Bricks.Buffer.Data =
           (byte *)CONCAT53(uStack_285,eVar8._8_3_);
      __return_storage_ptr__->Ok = false;
      ChunkAddress._4_4_ = 1;
    }
  }
  else {
    local_218.FileId = (file_id *)&local_1b0;
    eVar7 = ParallelReadChunk::anon_class_8_1_1e916d15::operator()(&local_218);
    local_210 = (allocator *)eVar7.Msg;
    local_228._8_2_ = eVar7._8_2_;
    local_208._0_1_ = local_228.Code;
    local_208._1_1_ = local_228.StackIdx;
    local_228.StrGened = eVar7.StrGened;
    uStack_206 = local_228.StrGened;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_002ffaa0;
    (__return_storage_ptr__->field_1).Err.Msg = (cstr)local_210;
    (__return_storage_ptr__->field_1).Val.Bricks.Buffer.Data =
         (byte *)CONCAT53(uStack_205,eVar7._8_3_);
    __return_storage_ptr__->Ok = false;
    ChunkAddress._4_4_ = 1;
  }
LAB_0027e9bb:
  local_228 = eVar7;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&FileId.Id);
  return __return_storage_ptr__;
}

Assistant:

expected<chunk_cache, idx2_err_code>
ParallelReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return *ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return *ChunkCacheIt.Val;
  }
#endif

  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  // TODO: lock and be careful about invalidated pointer
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFile(Idx2, D, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return *ChunkCache;
}